

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  string local_30;
  
  MessageInfo::MessageInfo(&this->m_info,&builder->m_info);
  this->m_moved = false;
  ReusableStringStream::str_abi_cxx11_(&local_30,(ReusableStringStream *)builder);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(this->m_info).message,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[6])(pIVar1,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage(MessageBuilder const &builder)
      : m_info(builder.m_info)
      , m_moved() {
    m_info.message = builder.m_stream.str();
    getResultCapture().pushScopedMessage(m_info);
  }